

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

xmlSchemaTypePtr xmlSchemaGetBuiltInType(xmlSchemaValType type)

{
  int iVar1;
  xmlSchemaTypePtr pxVar2;
  
  if ((xmlSchemaTypesInitialized == '\0') && (iVar1 = xmlSchemaInitTypes(), iVar1 < 0)) {
switchD_001a969b_default:
    pxVar2 = (xmlSchemaTypePtr)0x0;
  }
  else {
    switch(type) {
    case XML_SCHEMAS_STRING:
      pxVar2 = xmlSchemaTypeStringDef;
      break;
    case XML_SCHEMAS_NORMSTRING:
      pxVar2 = xmlSchemaTypeNormStringDef;
      break;
    case XML_SCHEMAS_DECIMAL:
      pxVar2 = xmlSchemaTypeDecimalDef;
      break;
    case XML_SCHEMAS_TIME:
      pxVar2 = xmlSchemaTypeTimeDef;
      break;
    case XML_SCHEMAS_GDAY:
      pxVar2 = xmlSchemaTypeGDayDef;
      break;
    case XML_SCHEMAS_GMONTH:
      pxVar2 = xmlSchemaTypeGMonthDef;
      break;
    case XML_SCHEMAS_GMONTHDAY:
      pxVar2 = xmlSchemaTypeGMonthDayDef;
      break;
    case XML_SCHEMAS_GYEAR:
      pxVar2 = xmlSchemaTypeGYearDef;
      break;
    case XML_SCHEMAS_GYEARMONTH:
      pxVar2 = xmlSchemaTypeGYearMonthDef;
      break;
    case XML_SCHEMAS_DATE:
      pxVar2 = xmlSchemaTypeDateDef;
      break;
    case XML_SCHEMAS_DATETIME:
      pxVar2 = xmlSchemaTypeDatetimeDef;
      break;
    case XML_SCHEMAS_DURATION:
      pxVar2 = xmlSchemaTypeDurationDef;
      break;
    case XML_SCHEMAS_FLOAT:
      pxVar2 = xmlSchemaTypeFloatDef;
      break;
    case XML_SCHEMAS_DOUBLE:
      pxVar2 = xmlSchemaTypeDoubleDef;
      break;
    case XML_SCHEMAS_BOOLEAN:
      pxVar2 = xmlSchemaTypeBooleanDef;
      break;
    case XML_SCHEMAS_TOKEN:
      pxVar2 = xmlSchemaTypeTokenDef;
      break;
    case XML_SCHEMAS_LANGUAGE:
      pxVar2 = xmlSchemaTypeLanguageDef;
      break;
    case XML_SCHEMAS_NMTOKEN:
      pxVar2 = xmlSchemaTypeNmtokenDef;
      break;
    case XML_SCHEMAS_NMTOKENS:
      pxVar2 = xmlSchemaTypeNmtokensDef;
      break;
    case XML_SCHEMAS_NAME:
      pxVar2 = xmlSchemaTypeNameDef;
      break;
    case XML_SCHEMAS_QNAME:
      pxVar2 = xmlSchemaTypeQNameDef;
      break;
    case XML_SCHEMAS_NCNAME:
      pxVar2 = xmlSchemaTypeNCNameDef;
      break;
    case XML_SCHEMAS_ID:
      pxVar2 = xmlSchemaTypeIdDef;
      break;
    case XML_SCHEMAS_IDREF:
      pxVar2 = xmlSchemaTypeIdrefDef;
      break;
    case XML_SCHEMAS_IDREFS:
      pxVar2 = xmlSchemaTypeIdrefsDef;
      break;
    case XML_SCHEMAS_ENTITY:
      pxVar2 = xmlSchemaTypeEntityDef;
      break;
    case XML_SCHEMAS_ENTITIES:
      pxVar2 = xmlSchemaTypeEntitiesDef;
      break;
    case XML_SCHEMAS_NOTATION:
      pxVar2 = xmlSchemaTypeNotationDef;
      break;
    case XML_SCHEMAS_ANYURI:
      pxVar2 = xmlSchemaTypeAnyURIDef;
      break;
    case XML_SCHEMAS_INTEGER:
      pxVar2 = xmlSchemaTypeIntegerDef;
      break;
    case XML_SCHEMAS_NPINTEGER:
      pxVar2 = xmlSchemaTypeNonPositiveIntegerDef;
      break;
    case XML_SCHEMAS_NINTEGER:
      pxVar2 = xmlSchemaTypeNegativeIntegerDef;
      break;
    case XML_SCHEMAS_NNINTEGER:
      pxVar2 = xmlSchemaTypeNonNegativeIntegerDef;
      break;
    case XML_SCHEMAS_PINTEGER:
      pxVar2 = xmlSchemaTypePositiveIntegerDef;
      break;
    case XML_SCHEMAS_INT:
      pxVar2 = xmlSchemaTypeIntDef;
      break;
    case XML_SCHEMAS_UINT:
      pxVar2 = xmlSchemaTypeUnsignedIntDef;
      break;
    case XML_SCHEMAS_LONG:
      pxVar2 = xmlSchemaTypeLongDef;
      break;
    case XML_SCHEMAS_ULONG:
      pxVar2 = xmlSchemaTypeUnsignedLongDef;
      break;
    case XML_SCHEMAS_SHORT:
      pxVar2 = xmlSchemaTypeShortDef;
      break;
    case XML_SCHEMAS_USHORT:
      pxVar2 = xmlSchemaTypeUnsignedShortDef;
      break;
    case XML_SCHEMAS_BYTE:
      pxVar2 = xmlSchemaTypeByteDef;
      break;
    case XML_SCHEMAS_UBYTE:
      pxVar2 = xmlSchemaTypeUnsignedByteDef;
      break;
    case XML_SCHEMAS_HEXBINARY:
      pxVar2 = xmlSchemaTypeHexBinaryDef;
      break;
    case XML_SCHEMAS_BASE64BINARY:
      pxVar2 = xmlSchemaTypeBase64BinaryDef;
      break;
    case XML_SCHEMAS_ANYTYPE:
      pxVar2 = xmlSchemaTypeAnyTypeDef;
      break;
    case XML_SCHEMAS_ANYSIMPLETYPE:
      pxVar2 = xmlSchemaTypeAnySimpleTypeDef;
      break;
    default:
      goto switchD_001a969b_default;
    }
  }
  return pxVar2;
}

Assistant:

xmlSchemaTypePtr
xmlSchemaGetBuiltInType(xmlSchemaValType type)
{
    if ((xmlSchemaTypesInitialized == 0) &&
	(xmlSchemaInitTypes() < 0))
        return (NULL);
    switch (type) {

	case XML_SCHEMAS_ANYSIMPLETYPE:
	    return (xmlSchemaTypeAnySimpleTypeDef);
	case XML_SCHEMAS_STRING:
	    return (xmlSchemaTypeStringDef);
	case XML_SCHEMAS_NORMSTRING:
	    return (xmlSchemaTypeNormStringDef);
	case XML_SCHEMAS_DECIMAL:
	    return (xmlSchemaTypeDecimalDef);
	case XML_SCHEMAS_TIME:
	    return (xmlSchemaTypeTimeDef);
	case XML_SCHEMAS_GDAY:
	    return (xmlSchemaTypeGDayDef);
	case XML_SCHEMAS_GMONTH:
	    return (xmlSchemaTypeGMonthDef);
	case XML_SCHEMAS_GMONTHDAY:
	    return (xmlSchemaTypeGMonthDayDef);
	case XML_SCHEMAS_GYEAR:
	    return (xmlSchemaTypeGYearDef);
	case XML_SCHEMAS_GYEARMONTH:
	    return (xmlSchemaTypeGYearMonthDef);
	case XML_SCHEMAS_DATE:
	    return (xmlSchemaTypeDateDef);
	case XML_SCHEMAS_DATETIME:
	    return (xmlSchemaTypeDatetimeDef);
	case XML_SCHEMAS_DURATION:
	    return (xmlSchemaTypeDurationDef);
	case XML_SCHEMAS_FLOAT:
	    return (xmlSchemaTypeFloatDef);
	case XML_SCHEMAS_DOUBLE:
	    return (xmlSchemaTypeDoubleDef);
	case XML_SCHEMAS_BOOLEAN:
	    return (xmlSchemaTypeBooleanDef);
	case XML_SCHEMAS_TOKEN:
	    return (xmlSchemaTypeTokenDef);
	case XML_SCHEMAS_LANGUAGE:
	    return (xmlSchemaTypeLanguageDef);
	case XML_SCHEMAS_NMTOKEN:
	    return (xmlSchemaTypeNmtokenDef);
	case XML_SCHEMAS_NMTOKENS:
	    return (xmlSchemaTypeNmtokensDef);
	case XML_SCHEMAS_NAME:
	    return (xmlSchemaTypeNameDef);
	case XML_SCHEMAS_QNAME:
	    return (xmlSchemaTypeQNameDef);
	case XML_SCHEMAS_NCNAME:
	    return (xmlSchemaTypeNCNameDef);
	case XML_SCHEMAS_ID:
	    return (xmlSchemaTypeIdDef);
	case XML_SCHEMAS_IDREF:
	    return (xmlSchemaTypeIdrefDef);
	case XML_SCHEMAS_IDREFS:
	    return (xmlSchemaTypeIdrefsDef);
	case XML_SCHEMAS_ENTITY:
	    return (xmlSchemaTypeEntityDef);
	case XML_SCHEMAS_ENTITIES:
	    return (xmlSchemaTypeEntitiesDef);
	case XML_SCHEMAS_NOTATION:
	    return (xmlSchemaTypeNotationDef);
	case XML_SCHEMAS_ANYURI:
	    return (xmlSchemaTypeAnyURIDef);
	case XML_SCHEMAS_INTEGER:
	    return (xmlSchemaTypeIntegerDef);
	case XML_SCHEMAS_NPINTEGER:
	    return (xmlSchemaTypeNonPositiveIntegerDef);
	case XML_SCHEMAS_NINTEGER:
	    return (xmlSchemaTypeNegativeIntegerDef);
	case XML_SCHEMAS_NNINTEGER:
	    return (xmlSchemaTypeNonNegativeIntegerDef);
	case XML_SCHEMAS_PINTEGER:
	    return (xmlSchemaTypePositiveIntegerDef);
	case XML_SCHEMAS_INT:
	    return (xmlSchemaTypeIntDef);
	case XML_SCHEMAS_UINT:
	    return (xmlSchemaTypeUnsignedIntDef);
	case XML_SCHEMAS_LONG:
	    return (xmlSchemaTypeLongDef);
	case XML_SCHEMAS_ULONG:
	    return (xmlSchemaTypeUnsignedLongDef);
	case XML_SCHEMAS_SHORT:
	    return (xmlSchemaTypeShortDef);
	case XML_SCHEMAS_USHORT:
	    return (xmlSchemaTypeUnsignedShortDef);
	case XML_SCHEMAS_BYTE:
	    return (xmlSchemaTypeByteDef);
	case XML_SCHEMAS_UBYTE:
	    return (xmlSchemaTypeUnsignedByteDef);
	case XML_SCHEMAS_HEXBINARY:
	    return (xmlSchemaTypeHexBinaryDef);
	case XML_SCHEMAS_BASE64BINARY:
	    return (xmlSchemaTypeBase64BinaryDef);
	case XML_SCHEMAS_ANYTYPE:
	    return (xmlSchemaTypeAnyTypeDef);
	default:
	    return (NULL);
    }
}